

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteMessageDocComment(Printer *printer,Descriptor *message)

{
  string *input;
  string local_38;
  Descriptor *local_18;
  Descriptor *message_local;
  Printer *printer_local;
  
  local_18 = message;
  message_local = (Descriptor *)printer;
  input = Descriptor::full_name_abi_cxx11_(message);
  EscapeJavadoc(&local_38,input);
  io::Printer::Print(printer,"/**\n * Protobuf type {@code $fullname$}\n","fullname",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  WriteDocCommentBody<google::protobuf::Descriptor>((Printer *)message_local,local_18);
  io::Printer::Print((Printer *)message_local," */\n");
  return;
}

Assistant:

void WriteMessageDocComment(io::Printer* printer, const Descriptor* message) {
  printer->Print(
    "/**\n"
    " * Protobuf type {@code $fullname$}\n",
    "fullname", EscapeJavadoc(message->full_name()));
  WriteDocCommentBody(printer, message);
  printer->Print(" */\n");
}